

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs-poll.c
# Opt level: O0

int uv_fs_poll_start(uv_fs_poll_t *handle,uv_fs_poll_cb cb,char *path,uint interval)

{
  int iVar1;
  uv_fs_t *req;
  long *plVar2;
  uint64_t uVar3;
  int in_ECX;
  char *in_RDX;
  long in_RSI;
  long in_RDI;
  size_t len;
  uv_loop_t *loop;
  poll_ctx *ctx;
  undefined4 in_stack_ffffffffffffffb8;
  uv_loop_t *loop_00;
  int local_4;
  
  if ((*(uint *)(in_RDI + 0x30) & 0x4000) == 0) {
    loop_00 = *(uv_loop_t **)(in_RDI + 0x10);
    req = (uv_fs_t *)strlen(in_RDX);
    plVar2 = (long *)calloc(1,(size_t)req[1].work_req.wq);
    if (plVar2 == (long *)0x0) {
      local_4 = -0xc;
    }
    else {
      plVar2[3] = (long)loop_00;
      plVar2[4] = in_RSI;
      if (in_ECX == 0) {
        in_ECX = 1;
      }
      *(int *)((long)plVar2 + 0xc) = in_ECX;
      uVar3 = uv_now(loop_00);
      plVar2[2] = uVar3;
      *plVar2 = in_RDI;
      memcpy(plVar2 + 0x55,in_RDX,(size_t)((long)&req->data + 1));
      iVar1 = uv_timer_init(loop_00,(uv_timer_t *)(plVar2 + 5));
      if (iVar1 != 0) {
        abort();
      }
      *(uint *)(plVar2 + 0xb) = *(uint *)(plVar2 + 0xb) | 0x8000;
      if (((*(uint *)(plVar2 + 0xb) & 0x2000) != 0) &&
         (*(uint *)(plVar2 + 0xb) = *(uint *)(plVar2 + 0xb) & 0xffffdfff,
         (*(uint *)(plVar2 + 0xb) & 0x4000) != 0)) {
        *(int *)(plVar2[7] + 8) = *(int *)(plVar2[7] + 8) + -1;
      }
      iVar1 = uv_fs_stat(loop_00,req,(char *)CONCAT44(in_ECX,in_stack_ffffffffffffffb8),
                         (uv_fs_cb)0x108411);
      if (iVar1 != 0) {
        abort();
      }
      *(long **)(in_RDI + 0x40) = plVar2;
      if (((*(uint *)(in_RDI + 0x30) & 0x4000) == 0) &&
         (*(uint *)(in_RDI + 0x30) = *(uint *)(in_RDI + 0x30) | 0x4000,
         (*(uint *)(in_RDI + 0x30) & 0x2000) != 0)) {
        *(int *)(*(long *)(in_RDI + 0x10) + 8) = *(int *)(*(long *)(in_RDI + 0x10) + 8) + 1;
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int uv_fs_poll_start(uv_fs_poll_t* handle,
                     uv_fs_poll_cb cb,
                     const char* path,
                     unsigned int interval) {
  struct poll_ctx* ctx;
  uv_loop_t* loop;
  size_t len;

  if (uv__is_active(handle))
    return 0;

  loop = handle->loop;
  len = strlen(path);
  ctx = calloc(1, sizeof(*ctx) + len);

  if (ctx == NULL)
    return UV_ENOMEM;

  ctx->loop = loop;
  ctx->poll_cb = cb;
  ctx->interval = interval ? interval : 1;
  ctx->start_time = uv_now(loop);
  ctx->parent_handle = handle;
  memcpy(ctx->path, path, len + 1);

  if (uv_timer_init(loop, &ctx->timer_handle))
    abort();

  ctx->timer_handle.flags |= UV__HANDLE_INTERNAL;
  uv__handle_unref(&ctx->timer_handle);

  if (uv_fs_stat(loop, &ctx->fs_req, ctx->path, poll_cb))
    abort();

  handle->poll_ctx = ctx;
  uv__handle_start(handle);

  return 0;
}